

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSat.c
# Opt level: O1

void * Abc_NtkMiterSatCreate(Abc_Ntk_t *pNtk,int fAllPrimes)

{
  byte *pbVar1;
  Abc_NtkType_t AVar2;
  Abc_Obj_t *pNode;
  int iVar3;
  long lVar4;
  sat_solver *psVar5;
  Mem_Flex_t *pMmMan;
  Vec_Str_t *vCube;
  char *pcVar6;
  Vec_Int_t *vVars;
  int *piVar7;
  Vec_Ptr_t *pVVar8;
  char *pSop0;
  char *local_40;
  char *local_38;
  
  AVar2 = pNtk->ntkType;
  if ((AVar2 != ABC_NTK_STRASH) && ((AVar2 != ABC_NTK_LOGIC || (pNtk->ntkFunc != ABC_FUNC_BDD)))) {
    __assert_fail("Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcSat.c"
                  ,0x27e,"void *Abc_NtkMiterSatCreate(Abc_Ntk_t *, int)");
  }
  if ((AVar2 != ABC_NTK_LOGIC) || (pNtk->ntkFunc != ABC_FUNC_BDD)) {
    nMuxes = 0;
    psVar5 = sat_solver_new();
    iVar3 = Abc_NtkMiterSatCreateInt(psVar5,pNtk);
    sat_solver_store_mark_roots(psVar5);
    pVVar8 = pNtk->vObjs;
    if (0 < pVVar8->nSize) {
      lVar4 = 0;
      do {
        if (pVVar8->pArray[lVar4] != (void *)0x0) {
          pbVar1 = (byte *)((long)pVVar8->pArray[lVar4] + 0x14);
          *pbVar1 = *pbVar1 & 0xef;
        }
        lVar4 = lVar4 + 1;
        pVVar8 = pNtk->vObjs;
      } while (lVar4 < pVVar8->nSize);
    }
    if (iVar3 != 0) {
      return psVar5;
    }
    sat_solver_delete(psVar5);
    return (void *)0x0;
  }
  pVVar8 = pNtk->vPis;
  if (0 < pVVar8->nSize) {
    lVar4 = 0;
    do {
      *(long *)((long)pVVar8->pArray[lVar4] + 0x40) =
           (long)*(int *)((long)pVVar8->pArray[lVar4] + 0x10);
      lVar4 = lVar4 + 1;
      pVVar8 = pNtk->vPis;
    } while (lVar4 < pVVar8->nSize);
  }
  psVar5 = sat_solver_new();
  sat_solver_store_alloc(psVar5);
  pMmMan = Mem_FlexStart();
  vCube = (Vec_Str_t *)malloc(0x10);
  vCube->nCap = 100;
  vCube->nSize = 0;
  pcVar6 = (char *)malloc(100);
  vCube->pArray = pcVar6;
  vVars = (Vec_Int_t *)malloc(0x10);
  vVars->nCap = 100;
  vVars->nSize = 0;
  piVar7 = (int *)malloc(400);
  vVars->pArray = piVar7;
  pVVar8 = pNtk->vObjs;
  if (0 < pVVar8->nSize) {
    lVar4 = 0;
    do {
      pNode = (Abc_Obj_t *)pVVar8->pArray[lVar4];
      if ((pNode != (Abc_Obj_t *)0x0) && ((*(uint *)&pNode->field_0x14 & 0xf) == 7)) {
        Abc_NodeBddToCnf(pNode,pMmMan,vCube,fAllPrimes,&local_38,&local_40);
        iVar3 = Abc_NodeAddClauses(psVar5,local_38,local_40,pNode,vVars);
        if (iVar3 == 0) goto LAB_0029fa6c;
      }
      lVar4 = lVar4 + 1;
      pVVar8 = pNtk->vObjs;
    } while (lVar4 < pVVar8->nSize);
  }
  pVVar8 = pNtk->vPos;
  if (0 < pVVar8->nSize) {
    lVar4 = 0;
    do {
      iVar3 = Abc_NodeAddClausesTop(psVar5,(Abc_Obj_t *)pVVar8->pArray[lVar4],vVars);
      if (iVar3 == 0) goto LAB_0029fa6c;
      lVar4 = lVar4 + 1;
      pVVar8 = pNtk->vPos;
    } while (lVar4 < pVVar8->nSize);
  }
  sat_solver_store_mark_roots(psVar5);
LAB_0029fa76:
  if (vCube->pArray != (char *)0x0) {
    free(vCube->pArray);
    vCube->pArray = (char *)0x0;
  }
  free(vCube);
  if (vVars->pArray != (int *)0x0) {
    free(vVars->pArray);
    vVars->pArray = (int *)0x0;
  }
  free(vVars);
  Mem_FlexStop(pMmMan,0);
  return psVar5;
LAB_0029fa6c:
  sat_solver_delete(psVar5);
  psVar5 = (sat_solver *)0x0;
  goto LAB_0029fa76;
}

Assistant:

void * Abc_NtkMiterSatCreate( Abc_Ntk_t * pNtk, int fAllPrimes )
{
    sat_solver * pSat;
    Abc_Obj_t * pNode;
    int RetValue, i; //, clk = Abc_Clock();

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsBddLogic(pNtk) );
    if ( Abc_NtkIsBddLogic(pNtk) )
        return Abc_NtkMiterSatCreateLogic(pNtk, fAllPrimes);

    nMuxes = 0;
    pSat = sat_solver_new();
//sat_solver_store_alloc( pSat );
    RetValue = Abc_NtkMiterSatCreateInt( pSat, pNtk );
sat_solver_store_mark_roots( pSat );

    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->fMarkA = 0;
//    ASat_SolverWriteDimacs( pSat, "temp_sat.cnf", NULL, NULL, 1 );
    if ( RetValue == 0 )
    {
        sat_solver_delete(pSat);
        return NULL;
    }
//    printf( "Ands = %6d.  Muxes = %6d (%5.2f %%).  ", Abc_NtkNodeNum(pNtk), nMuxes, 300.0*nMuxes/Abc_NtkNodeNum(pNtk) );
//    ABC_PRT( "Creating sat_solver", Abc_Clock() - clk );
    return pSat;
}